

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccpp.c
# Opt level: O2

void define_print(TCCState *s1,int v)

{
  FILE *pFVar1;
  Sym *pSVar2;
  char *pcVar3;
  Sym *pSVar4;
  long lVar5;
  int *piVar6;
  undefined1 local_58 [8];
  CValue cval;
  int *local_40;
  int local_34 [2];
  int t;
  
  pSVar2 = define_find(v);
  if ((pSVar2 != (Sym *)0x0) && ((pSVar2->field_3).enum_val != 0)) {
    pFVar1 = (FILE *)s1->ppfp;
    pcVar3 = get_tok_str(v,(CValue *)0x0);
    fprintf(pFVar1,"#define %s",pcVar3);
    if ((pSVar2->type).t == 1) {
      pSVar4 = (pSVar2->field_5).next;
      fputc(0x28,pFVar1);
      if (pSVar4 != (Sym *)0x0) {
        while( true ) {
          pcVar3 = get_tok_str(pSVar4->v & 0xdfffffff,(CValue *)0x0);
          fputs(pcVar3,pFVar1);
          pSVar4 = (pSVar4->field_5).next;
          if (pSVar4 == (Sym *)0x0) break;
          fputc(0x2c,pFVar1);
        }
      }
      fputc(0x29,pFVar1);
    }
    piVar6 = (int *)(pSVar2->field_3).enum_val;
    pFVar1 = (FILE *)tcc_state->ppfp;
    local_40 = piVar6;
    fputs("",pFVar1);
    lVar5 = 0;
    while ((piVar6 != (int *)0x0 &&
           (TOK_GET(local_34,&local_40,(CValue *)local_58), local_34[0] != 0))) {
      pcVar3 = get_tok_str(local_34[0],(CValue *)local_58);
      fprintf(pFVar1,"field not found: %s" + lVar5 + 0x10,pcVar3);
      lVar5 = 1;
      piVar6 = local_40;
    }
    fputc(10,pFVar1);
  }
  return;
}

Assistant:

static void define_print(TCCState* s1, int v) {
  FILE* fp;
  Sym* s;

  s = define_find(v);
  if (NULL == s || NULL == s->d)
    return;

  fp = s1->ppfp;
  fprintf(fp, "#define %s", get_tok_str(v, NULL));
  if (s->type.t == MACRO_FUNC) {
    Sym* a = s->next;
    fprintf(fp, "(");
    if (a)
      for (;;) {
        fprintf(fp, "%s", get_tok_str(a->v & ~SYM_FIELD, NULL));
        if (!(a = a->next))
          break;
        fprintf(fp, ",");
      }
    fprintf(fp, ")");
  }
  tok_print("", s->d);
}